

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall
AccelParam::StartSpeedControl
          (AccelParam *this,double _startSpeed,double _targetSpeed,double _deltaDist,
          double _startTime,double _targetTime,LTAircraft *pAc)

{
  double dVar1;
  bool bVar2;
  logLevelTy lVar3;
  double *pdVar4;
  undefined8 uVar5;
  AccelParam *in_RDI;
  char *in_XMM0_Qa;
  double dVar6;
  char *szPath;
  char *in_XMM1_Qa;
  char *in_XMM2_Qa;
  char *in_XMM3_Qa;
  double in_XMM4_Qa;
  double accel;
  double tx;
  double deltaSpeed;
  double avgSpeed;
  double deltaTime;
  LTAircraft *in_stack_000002b8;
  string *psVar7;
  string *in_stack_ffffffffffffff70;
  DataRefs *in_stack_ffffffffffffff78;
  string local_68 [32];
  double local_48;
  double local_40;
  double local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  if ((currCycle.simTime < in_XMM4_Qa) && ((double)in_XMM3_Qa < in_XMM4_Qa)) {
    local_40 = in_XMM4_Qa - (double)in_XMM3_Qa;
    local_48 = (double)in_XMM2_Qa / local_40;
    local_30 = in_XMM4_Qa;
    local_28 = in_XMM3_Qa;
    local_20 = in_XMM2_Qa;
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    bVar2 = dequal((double)in_XMM2_Qa,0.0);
    if ((bVar2) || (bVar2 = dequal(local_40,0.0), bVar2)) {
      SetSpeed(in_RDI,(double)local_18);
    }
    else {
      if (((double)local_10 <= local_48) || (local_48 <= (double)local_18)) {
        if ((local_48 <= (double)local_10) || ((double)local_18 <= local_48)) {
          LTAircraft::key_abi_cxx11_((LTAircraft *)0x18d236);
          bVar2 = DataRefs::GetDebugAcPos(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          if ((bVar2) &&
             (lVar3 = DataRefs::GetLogLevel(&dataRefs), dVar1 = local_40, dVar6 = local_48,
             (int)lVar3 < 1)) {
            psVar7 = local_68;
            LTAircraft::operator_cast_to_string(in_stack_000002b8);
            uVar5 = std::__cxx11::string::c_str();
            LogMsg(local_10,(int)dVar6,local_20,(logLevelTy)dVar1,local_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                   ,0x1d3,"StartSpeedControl",0,
                   "CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s"
                   ,uVar5,psVar7);
            std::__cxx11::string::~string(local_68);
          }
          SetSpeed(in_RDI,local_48);
          return;
        }
        if ((double)local_10 < local_48 - ((double)local_18 - local_48)) {
          local_10 = (char *)(local_48 - ((double)local_18 - local_48));
        }
      }
      else if (local_48 + (local_48 - (double)local_18) < (double)local_10) {
        local_10 = (char *)(local_48 + (local_48 - (double)local_18));
      }
      dVar6 = (double)local_18 - (double)local_10;
      szPath = (char *)((2.0 / dVar6) *
                       (((double)local_10 * local_40 + (dVar6 / 2.0) * local_30) - (double)local_20)
                       );
      dVar6 = dVar6 / (local_30 - (double)szPath);
      if (local_30 < (double)szPath) {
        lVar3 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar3 < 4) {
          LTAircraft::key_abi_cxx11_((LTAircraft *)0x18d4b5);
          uVar5 = std::__cxx11::string::c_str();
          LogMsg(szPath,(int)local_10,local_18,(logLevelTy)local_20,local_28,local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                 ,0x1f7,"StartSpeedControl",3,
                 "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",
                 uVar5);
        }
        SetSpeed(in_RDI,local_48);
      }
      else {
        SetSpeed(in_RDI,(double)local_10);
        in_RDI->startSpeed = (double)local_10;
        in_RDI->targetSpeed = (double)local_18;
        in_RDI->acceleration = dVar6;
        in_RDI->targetDeltaDist = (double)local_20;
        in_RDI->startTime = (double)local_28;
        pdVar4 = std::max<double>((double *)&stack0xffffffffffffff78,(double *)&local_28);
        in_RDI->accelStartTime = *pdVar4;
        in_RDI->targetTime = local_30;
      }
    }
  }
  return;
}

Assistant:

void AccelParam::StartSpeedControl(double _startSpeed, double _targetSpeed,
                                   double _deltaDist,
                                   double _startTime, double _targetTime,
                                   const LTAircraft* pAc)
{
    // Sanity checks
    if (_targetTime <= currCycle.simTime || _startTime >= _targetTime)
        return;

    const double deltaTime = _targetTime - _startTime;
    const double avgSpeed = _deltaDist / deltaTime;
    
    // Sanity checks: ∆distance and ∆t should not be too close to zero
    if (dequal(_deltaDist, 0) || dequal(deltaTime, 0)) {
        SetSpeed(_targetSpeed);
        return;
    }

    // If current speed and target speed are on opposite sides of
    // average speed then we can continue with current speed
    // up to a point from which we accelerate/decelerate to 'to'-position
    // (formula documentation see Notes.txt)
    // tx =  2/∆v * (vi * ∆t + ∆v/2 * tt - d)
    
    // decelerate (currently above avg, target below avg: keep current speed
    // until it is time [tx] to deceleration)
    if (_startSpeed > avgSpeed && avgSpeed > _targetSpeed)
    {
        // is startSpeed too fast? (too far on the other side of average?)
        if (_startSpeed > avgSpeed + (avgSpeed - _targetSpeed))
            // too fast, so we reduce startSpart to mirror targetSpeed on the other side of average speed
            _startSpeed = avgSpeed + (avgSpeed - _targetSpeed);
    }
    // accelerate (currently below avg, target above)
    else if (_startSpeed < avgSpeed && avgSpeed < _targetSpeed)
    {
        // is startSpeed too slow? (too far on the other side of average?)
        if (_startSpeed < avgSpeed - (_targetSpeed - avgSpeed))
            // too slow, increase to mirror targetSPeed
            _startSpeed = avgSpeed - (_targetSpeed - avgSpeed);
        
    }
    // no way of complying to input parameters under our conditions:
    // set constant speed and return
    else {
        // output debug info on request
        if (dataRefs.GetDebugAcPos(pAc->key())) {
            LOG_MSG(logDEBUG,"CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s",
                    _startSpeed,
                    avgSpeed, _deltaDist, deltaTime,
                    _targetSpeed,
                    std::string(*pAc).c_str());
        }
        SetSpeed(avgSpeed);
        return;
    }
    
    // continue with dynamic speed:
    // calc the time when to start speed change
    const double deltaSpeed = _targetSpeed - _startSpeed;
    const double tx = 2/deltaSpeed * (_startSpeed * deltaTime +
                         deltaSpeed/2 * _targetTime -
                         _deltaDist);
    const double accel = deltaSpeed / (_targetTime - tx);
    
    // set object's values
    if (tx <= _targetTime) {            // expected...but in rare edge cases it seems possible to be violated
        SetSpeed(_startSpeed);          // reset, then set to calculated values:
        startSpeed = _startSpeed;
        targetSpeed = _targetSpeed;
        acceleration = accel;
        targetDeltaDist = _deltaDist;
        startTime = _startTime;
        accelStartTime = std::max(tx, _startTime);
        targetTime = _targetTime;
    //    if (dataRefs.GetDebugAcPos(pAc->key())) {
    //        LOG_MSG(logDEBUG,"%s: start=%.1f, in %.1fs: accel=%.1f,target=%.1f) for %s",
    //                acceleration >= 0.0 ? "ACCELERATION" : "DECELERATION",
    //                startSpeed,
    //                accelStartTime - startTime,
    //                acceleration,
    //                targetSpeed,
    //                std::string(*pAc).c_str());
    //    }
    } else {
        LOG_MSG(logERR, "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",
                pAc->key().c_str(), tx,
                _startSpeed, _targetSpeed, _deltaDist, _startTime, _targetTime);
        SetSpeed(avgSpeed);
        return;
    }
}